

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Polymer::Attach(Polymer *this,Ptr *pol)

{
  shared_ptr<Polymer> local_38;
  shared_ptr<MobileElement> local_28;
  Ptr *local_18;
  Ptr *pol_local;
  Polymer *this_local;
  
  local_18 = pol;
  pol_local = (Ptr *)this;
  std::shared_ptr<MobileElement>::shared_ptr(&local_28,pol);
  std::shared_ptr<Polymer>::shared_ptr(&local_38);
  MobileElementManager::Insert(&this->polymerases_,&local_28,&local_38);
  std::shared_ptr<Polymer>::~shared_ptr(&local_38);
  std::shared_ptr<MobileElement>::~shared_ptr(&local_28);
  return;
}

Assistant:

void Polymer::Attach(MobileElement::Ptr pol) {
  polymerases_.Insert(pol, Polymer::Ptr());
}